

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_stringbuilder.cpp
# Opt level: O3

int __thiscall
icu_63::number::impl::NumberStringBuilder::remove(NumberStringBuilder *this,char *__filename)

{
  int iVar1;
  ValueOrHeapArray<char16_t> *pVVar2;
  ValueOrHeapArray<UNumberFormatFields> *pVVar3;
  int in_EDX;
  int32_t iVar4;
  long lVar5;
  
  lVar5 = (long)this->fZero + (long)(int)__filename;
  iVar1 = this->fLength;
  iVar4 = (int)__filename + in_EDX;
  if (iVar1 - iVar4 != 0) {
    if (this->fUsingHeap == false) {
      pVVar2 = &this->fChars;
    }
    else {
      pVVar2 = (ValueOrHeapArray<char16_t> *)(this->fChars).heap.ptr;
    }
    memmove(pVVar2->value + lVar5,pVVar2->value + lVar5 + in_EDX,(long)(iVar1 - iVar4) * 2);
    iVar1 = this->fLength;
  }
  if (iVar1 - iVar4 != 0) {
    if (this->fUsingHeap == false) {
      pVVar3 = &this->fFields;
    }
    else {
      pVVar3 = (ValueOrHeapArray<UNumberFormatFields> *)(this->fFields).heap.ptr;
    }
    memmove(pVVar3->value + lVar5,pVVar3->value + lVar5 + in_EDX,(long)(iVar1 - iVar4) << 2);
    iVar4 = this->fLength;
  }
  this->fLength = iVar4 - in_EDX;
  return (int)lVar5;
}

Assistant:

int32_t NumberStringBuilder::remove(int32_t index, int32_t count) {
    // TODO: Reset the heap here?  (If the string after removal can fit on stack?)
    int32_t position = index + fZero;
    uprv_memmove2(getCharPtr() + position,
            getCharPtr() + position + count,
            sizeof(char16_t) * (fLength - index - count));
    uprv_memmove2(getFieldPtr() + position,
            getFieldPtr() + position + count,
            sizeof(Field) * (fLength - index - count));
    fLength -= count;
    return position;
}